

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*(run_for_at_least_argument_t<system_clock,_vector<double,_allocator<double>_>_(*)(int)>))(int)>
* nonius::detail::
  run_for_at_least<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*)(int)>
            (parameters *params,Duration<std::chrono::_V2::system_clock> how_long,int seed,
            _func_vector<double,_std::allocator<double>_>_int **fun)

{
  bool bVar1;
  optimized_away_error *this;
  int in_ECX;
  undefined8 in_RSI;
  TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*(run_for_at_least_argument_t<system_clock,_vector<double,_allocator<double>_>_(*)(int)>))(int)>
  *in_RDI;
  undefined8 in_R8;
  TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int))(int)> *timing;
  int iters;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  int iterations;
  vector<double,_std::allocator<double>_> *result;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 uVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> elapsed;
  undefined1 local_98 [24];
  pointer local_80;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> *local_38;
  int local_2c;
  undefined8 local_28;
  undefined8 local_18;
  
  elapsed.__r = (rep_conflict)in_RDI;
  local_2c = in_ECX;
  local_28 = in_R8;
  local_18 = in_RSI;
  do {
    if (0x3fffffff < local_2c) {
      this = (optimized_away_error *)__cxa_allocate_exception(8);
      memset(this,0,8);
      optimized_away_error::optimized_away_error(this);
      __cxa_throw(this,&optimized_away_error::typeinfo,optimized_away_error::~optimized_away_error);
    }
    result = &local_60;
    measure_one<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*&)(int)>
              (result,local_28,local_2c,local_18);
    local_38 = result;
    bVar1 = std::chrono::operator>=
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff30,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff28);
    if (bVar1) {
      local_80 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      iterations = (int)((ulong)local_98 >> 0x20);
      uVar2 = bVar1;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
      ::timing((timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
                *)CONCAT17(uVar2,in_stack_ffffffffffffff48),elapsed,result,iterations);
      std::vector<double,_std::allocator<double>_>::~vector(result);
    }
    else {
      local_2c = local_2c << 1;
    }
    timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
    ::~timing((timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
               *)0x21b83d);
  } while (!bVar1);
  return in_RDI;
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }